

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool sx_ishex(char *str)

{
  _Bool _Var1;
  char *local_18;
  char *str_local;
  
  local_18 = str;
  while( true ) {
    if (*local_18 == '\0') {
      return true;
    }
    _Var1 = sx_ishexchar(*local_18);
    if (!_Var1) break;
    local_18 = local_18 + 1;
  }
  return false;
}

Assistant:

bool sx_ishex(const char* str)
{
    while (*str) {
        if (!sx_ishexchar(*str))
            return false;
        ++str;
    }
    return true;
}